

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O2

void PDHG_Compute_Average_Iterate(CUPDLPwork *work)

{
  double dVar1;
  double dVar2;
  CUPDLPiterates *pCVar3;
  CUPDLPdata *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  pCVar3 = work->iterates;
  pCVar4 = work->problem->data;
  dVar1 = work->stepsize->dSumPrimalStep;
  dVar2 = work->stepsize->dSumDualStep;
  uVar5 = -(ulong)(0.0 < dVar1);
  uVar6 = -(ulong)(0.0 < dVar2);
  memcpy(pCVar3->xAverage->data,pCVar3->xSum,(long)pCVar4->nCols << 3);
  memcpy(pCVar3->yAverage->data,pCVar3->ySum,(long)pCVar4->nRows << 3);
  cupdlp_scaleVector(work,(cupdlp_float)(~uVar5 & 0x3ff0000000000000 | (ulong)(1.0 / dVar1) & uVar5)
                     ,pCVar3->xAverage->data,pCVar4->nCols);
  cupdlp_scaleVector(work,(cupdlp_float)(~uVar6 & 0x3ff0000000000000 | (ulong)(1.0 / dVar2) & uVar6)
                     ,pCVar3->yAverage->data,pCVar4->nRows);
  Ax(work,pCVar3->axAverage,pCVar3->xAverage);
  ATy(work,pCVar3->atyAverage,pCVar3->yAverage);
  return;
}

Assistant:

void PDHG_Compute_Average_Iterate(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_float dPrimalScale =
      stepsize->dSumPrimalStep > 0.0 ? 1.0 / stepsize->dSumPrimalStep : 1.0;
  cupdlp_float dDualScale =
      stepsize->dSumDualStep > 0.0 ? 1.0 / stepsize->dSumDualStep : 1.0;

  // cupdlp_scaleVector(iterates->xAverage, iterates->xSum, dPrimalScale,
  // lp->nCols); cupdlp_scaleVector(iterates->yAverage, iterates->ySum,
  // dDualScale, lp->nRows);

  CUPDLP_COPY_VEC(iterates->xAverage->data, iterates->xSum, cupdlp_float,
                  lp->nCols);
  CUPDLP_COPY_VEC(iterates->yAverage->data, iterates->ySum, cupdlp_float,
                  lp->nRows);
  cupdlp_scaleVector(work, dPrimalScale, iterates->xAverage->data, lp->nCols);
  cupdlp_scaleVector(work, dDualScale, iterates->yAverage->data, lp->nRows);

  // Ax(work, iterates->axAverage, iterates->xAverage);
  // ATyCPU(work, iterates->atyAverage, iterates->yAverage);
  Ax(work, iterates->axAverage, iterates->xAverage);
  ATy(work, iterates->atyAverage, iterates->yAverage);
}